

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void licm_add_loop_preheaders(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  void **ppvVar1;
  char cVar2;
  uint uVar3;
  bb_insn_t pbVar4;
  bb_insn_t pbVar5;
  FILE *pFVar6;
  func_cfg_t pfVar7;
  bb_t_conflict pbVar8;
  func_cfg_t pfVar9;
  bb_t pbVar10;
  void *pvVar11;
  MIR_context_t pMVar12;
  FILE *__s;
  VARR_size_t *pVVar13;
  bitmap_t pVVar14;
  long lVar15;
  gen_ctx **ppgVar16;
  int iVar17;
  undefined4 uVar18;
  in_edge_t_conflict peVar19;
  gen_ctx *pgVar20;
  gen_ctx *pgVar21;
  MIR_insn_t pMVar22;
  gen_ctx *pgVar23;
  MIR_context_t pMVar24;
  HTAB_MIR_item_t *pHVar25;
  gen_ctx *pgVar26;
  gen_ctx *pgVar27;
  ulong uVar28;
  gen_ctx *pgVar29;
  ulong uVar30;
  ulong uVar31;
  bitmap_t *ppVVar32;
  gen_ctx *extraout_RDX;
  bitmap_t extraout_RDX_00;
  long *extraout_RDX_01;
  MIR_insn_t pMVar33;
  gen_ctx_t pgVar34;
  VARR_MIR_proto_t **ppVVar35;
  gen_ctx *pgVar36;
  loop_node_t_conflict after;
  char *pcVar37;
  gen_ctx *pgVar38;
  gen_ctx *pgVar39;
  byte bVar40;
  ulong in_R11;
  gen_ctx *pgVar41;
  anon_union_32_12_57d33f68_for_u *paVar42;
  long lVar43;
  loop_node_t loop_00;
  in_edge_t_conflict e;
  bb_insn_t_conflict bb_insn;
  bool bVar44;
  int iStack_1a0;
  MIR_reg_t MStack_19c;
  ulong uStack_198;
  insn_var_iterator_t iStack_190;
  gen_ctx *pgStack_170;
  gen_ctx *pgStack_168;
  gen_ctx *pgStack_160;
  gen_ctx *pgStack_158;
  gen_ctx *pgStack_150;
  gen_ctx *pgStack_148;
  code *pcStack_140;
  code *pcStack_138;
  gen_ctx *pgStack_130;
  gen_ctx_t pgStack_128;
  gen_ctx *pgStack_120;
  int iStack_114;
  MIR_context_t pMStack_110;
  gen_ctx *pgStack_108;
  gen_ctx *pgStack_100;
  int iStack_f4;
  MIR_context_t pMStack_f0;
  MIR_context_t pMStack_e8;
  gen_ctx *pgStack_e0;
  gen_ctx *pgStack_d8;
  undefined4 uStack_d0;
  uint uStack_cc;
  gen_ctx *pgStack_c8;
  ulong uStack_c0;
  MIR_context_t pMStack_b8;
  undefined4 uStack_ac;
  int iStack_a8;
  int iStack_a4;
  gen_ctx *pgStack_a0;
  gen_ctx *pgStack_98;
  gen_ctx *pgStack_90;
  ulong uStack_88;
  VARR_MIR_proto_t **ppVStack_80;
  long lStack_78;
  ulong uStack_70;
  gen_ctx_t pgStack_68;
  gen_ctx *pgStack_60;
  gen_ctx *pgStack_58;
  loop_node_t_conflict plStack_50;
  edge_t_conflict peStack_48;
  FILE *pFStack_40;
  
  loop_00 = (loop->children).head;
  if (loop_00 != (loop_node_t)0x0) {
    bVar44 = false;
    do {
      if (loop_00->bb == (bb_t)0x0) {
        pFStack_40 = (FILE *)0x16a010;
        licm_add_loop_preheaders(gen_ctx,loop_00);
        bVar44 = true;
      }
      loop_00 = (loop_00->children_link).next;
    } while (loop_00 != (loop_node_t)0x0);
    if (bVar44) {
      return;
    }
  }
  if (gen_ctx->curr_cfg->root_loop_node == loop) {
    return;
  }
  (loop->u).preheader = (loop_node_t)0x0;
  e = (in_edge_t_conflict)0x0;
  for (peVar19 = (loop->entry->bb->in_edges).head; peVar19 != (in_edge_t_conflict)0x0;
      peVar19 = (peVar19->in_link).next) {
    if ((peVar19->back_edge_p == '\0') &&
       (bVar44 = e != (in_edge_t_conflict)0x0, e = peVar19, bVar44)) goto LAB_0016a09d;
  }
  if (e == (in_edge_t_conflict)0x0) {
LAB_0016a09d:
    e = (edge_t_conflict)0x0;
  }
  else {
    pbVar5 = (e->src->bb_insns).tail;
    pbVar4 = (e->dst->bb_insns).head;
    if ((pbVar4 != (bb_insn_t)0x0 && pbVar5 != (bb_insn_t)0x0) &&
       ((pbVar5->insn->insn_link).next != pbVar4->insn)) goto LAB_0016a09d;
  }
  if (e == (edge_t_conflict)0x0) {
    return;
  }
  pbVar5 = (e->src->bb_insns).tail;
  if (((pbVar5 == (bb_insn_t)0x0) ||
      (iVar17 = (int)*(undefined8 *)&pbVar5->insn->field_0x18, iVar17 == 0x76)) ||
     ((iVar17 - 0xa5U < 0xffffffd1 && ((iVar17 != 0xa6 && (iVar17 != 0xaa)))))) {
    loop->u = (anon_union_8_2_35464522_for_u)e->src->loop_node;
    (e->src->loop_node->u).preheader = loop;
    return;
  }
  pFStack_40 = (FILE *)0x16a10a;
  pgVar20 = (gen_ctx *)create_bb(gen_ctx,(MIR_insn_t)0x0);
  pFStack_40 = (FILE *)0x16a118;
  pgVar21 = (gen_ctx *)create_loop_node(gen_ctx,(bb_t_conflict)pgVar20);
  pFVar6 = (FILE *)loop->parent;
  pFStack_40 = (FILE *)0x16a12a;
  pgVar36 = pgVar20;
  pgVar34 = gen_ctx;
  add_new_bb(gen_ctx,(bb_t_conflict)pgVar20);
  pfVar7 = gen_ctx->curr_cfg;
  pbVar8 = *(bb_t_conflict *)&pgVar20->debug_level;
  if (pbVar8 == (bb_t_conflict)0x0) {
    if ((gen_ctx *)(pfVar7->bbs).head == pgVar20) {
      (pfVar7->bbs).head = (bb_t_conflict)pgVar20->to_free;
      goto LAB_0016a159;
    }
    pFStack_40 = (FILE *)0x16a263;
    licm_add_loop_preheaders_cold_1();
  }
  else {
    (pbVar8->bb_link).next = (bb_t)pgVar20->to_free;
LAB_0016a159:
    pfVar9 = (func_cfg_t)pgVar20->to_free;
    if ((pfVar9 != (func_cfg_t)0x0) || (pfVar9 = pfVar7, (gen_ctx *)(pfVar7->bbs).tail == pgVar20))
    {
      (pfVar9->bbs).tail = pbVar8;
      *(undefined8 *)&pgVar20->debug_level = 0;
      pgVar20->to_free = (VARR_void_ptr_t *)0x0;
      pFStack_40 = (FILE *)0x16a1a3;
      DLIST_bb_t_insert_before(&gen_ctx->curr_cfg->bbs,e->dst,(bb_t_conflict)pgVar20);
      if (pFVar6 == (FILE *)0x0) {
        pFStack_40 = (FILE *)0x16a25e;
        __assert_fail("parent != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x147d,"void create_preheader_from_edge(gen_ctx_t, edge_t, loop_node_t)");
      }
      pbVar10 = (e->dst->bb_link).prev;
      if ((pbVar10 == (bb_t)0x0) || (after = pbVar10->loop_node, (FILE *)after->parent != pFVar6)) {
        after = e->src->loop_node;
        if ((FILE *)after->parent != pFVar6) {
          pFStack_40 = (FILE *)0x16a1e2;
          DLIST_loop_node_t_append
                    ((DLIST_loop_node_t *)&pFVar6->_IO_write_ptr,(loop_node_t_conflict)pgVar21);
          goto LAB_0016a1f0;
        }
      }
      pFStack_40 = (FILE *)0x16a1f0;
      DLIST_loop_node_t_insert_after
                ((DLIST_loop_node_t *)&pFVar6->_IO_write_ptr,after,(loop_node_t_conflict)pgVar21);
LAB_0016a1f0:
      pgVar21->debug_file = pFVar6;
      *(loop_node_t_conflict *)&pgVar21->debug_level = loop;
      (loop->u).preheader = (loop_node_t)pgVar21;
      pFStack_40 = (FILE *)0x16a212;
      create_edge(gen_ctx,e->src,(bb_t_conflict)pgVar20,1,0);
      pFStack_40 = (FILE *)0x16a229;
      create_edge(gen_ctx,(bb_t_conflict)pgVar20,e->dst,1,0);
      delete_edge(e);
      return;
    }
  }
  pFStack_40 = (FILE *)loop_licm;
  licm_add_loop_preheaders_cold_2();
  pgVar41 = (gen_ctx *)pgVar34->temp_bitmap;
  pgVar27 = (gen_ctx *)pgVar34->temp_bitmap2;
  pgVar26 = (gen_ctx *)pgVar34->temp_bb_insns;
  pgVar29 = (gen_ctx *)pgVar36->to_free;
  pcVar37 = (char *)pgVar36;
  pgStack_130 = pgVar26;
  pgStack_128 = pgVar34;
  pgStack_68 = gen_ctx;
  pgStack_60 = pgVar20;
  pgStack_58 = pgVar21;
  plStack_50 = loop;
  peStack_48 = e;
  pFStack_40 = pFVar6;
  if (pgVar29 == (gen_ctx *)0x0) {
    pgVar20 = (gen_ctx *)0x0;
    bVar44 = true;
  }
  else {
    pgVar20 = (gen_ctx *)0x0;
    bVar44 = false;
    do {
      if (*(long *)&pgVar29->optimize_level == 0) {
        pcStack_138 = (code *)0x16a2b5;
        pcVar37 = (char *)pgVar29;
        iVar17 = loop_licm(pgStack_128,(loop_node_t_conflict)pgVar29);
        bVar44 = true;
        pgVar26 = pgStack_130;
        if (iVar17 != 0) {
          pgVar20 = (gen_ctx *)&DAT_00000001;
        }
      }
      pgVar29 = (gen_ctx *)pgVar29->addr_regs;
    } while (pgVar29 != (gen_ctx *)0x0);
    bVar44 = !bVar44;
  }
  pgVar29 = (gen_ctx *)0x0;
  uStack_d0 = SUB84(pgVar20,0);
  if (((!bVar44) || ((gen_ctx *)pgStack_128->curr_cfg->root_loop_node == pgVar36)) ||
     (((MIR_op_t *)&pgVar36->debug_level)->data == (void *)0x0)) {
    return;
  }
  pgVar38 = (gen_ctx *)pgStack_128->debug_file;
  if ((pgVar38 != (gen_ctx *)0x0) && (1 < *(int *)&((MIR_op_t *)&pgStack_128->debug_level)->data)) {
    pcVar37 = "Processing Loop%3lu for loop invariant motion:\n";
    pcStack_138 = (code *)0x16a32d;
    fprintf((FILE *)pgVar38,"Processing Loop%3lu for loop invariant motion:\n",
            (ulong)*(uint *)&pgVar36->ctx);
    pgVar26 = pgStack_130;
  }
  if ((pgVar26 == (gen_ctx *)0x0) || ((MIR_insn_t)pgVar26->curr_func_item == (MIR_insn_t)0x0)) {
LAB_0016adfb:
    pcStack_138 = (code *)0x16ae00;
    loop_licm_cold_12();
    pgVar39 = pgVar38;
LAB_0016ae00:
    pcStack_138 = (code *)0x16ae05;
    loop_licm_cold_11();
  }
  else {
    pgVar26->ctx = (MIR_context_t)0x0;
    pgVar39 = pgVar38;
    pgStack_c8 = pgVar27;
    if ((pgVar41 == (gen_ctx *)0x0) || (pgVar41->curr_func_item == (MIR_item_t)0x0))
    goto LAB_0016ae00;
    pgVar41->ctx = (MIR_context_t)0x0;
    pgVar21 = (gen_ctx *)pgVar36->to_free;
    pgVar34 = pgStack_128;
    pgStack_100 = pgVar36;
    if (pgVar21 != (gen_ctx *)0x0) {
      pgVar20 = (gen_ctx *)&DAT_00000001;
      do {
        pMVar22 = ((DLIST_LINK_MIR_insn_t *)&pgVar21->optimize_level)->prev;
        if (pMVar22 != (MIR_insn_t)0x0) {
          for (bb_insn = (bb_insn_t_conflict)pMVar22[1].data; bb_insn != (bb_insn_t_conflict)0x0;
              bb_insn = (bb_insn->bb_insn_link).next) {
            pgVar26 = (gen_ctx *)0x0;
            pcStack_138 = (code *)0x16a3b6;
            pcVar37 = (char *)pgStack_100;
            pgVar38 = pgVar34;
            iVar17 = loop_invariant_p(pgVar34,(loop_node_t_conflict)pgStack_100,bb_insn,
                                      (bitmap_t)0x0);
            if (iVar17 != 0) {
              if ((MIR_insn_t)pgStack_130->curr_func_item == (MIR_insn_t)0x0) goto LAB_0016adb9;
              pMVar22 = (MIR_insn_t)((long)&pgStack_130->ctx->gen_ctx + 1);
              if (((DLIST_LINK_MIR_insn_t *)&pgStack_130->optimize_level)->prev < pMVar22) {
                pMVar33 = (MIR_insn_t)((long)pMVar22->ops + (((ulong)pMVar22 >> 1) - 0x20));
                pcStack_138 = (code *)0x16a3ed;
                pMVar22 = (MIR_insn_t)
                          realloc((MIR_insn_t)pgStack_130->curr_func_item,(long)pMVar33 * 8);
                pgStack_130->curr_func_item = (MIR_item_t)pMVar22;
                ((DLIST_LINK_MIR_insn_t *)&pgStack_130->optimize_level)->prev = pMVar33;
              }
              pMVar24 = pgStack_130->ctx;
              pgStack_130->ctx = (MIR_context_t)((long)&pMVar24->gen_ctx + 1);
              *(bb_insn_t_conflict *)
               ((long)((MIR_insn_t)pgStack_130->curr_func_item)->ops + (long)pMVar24 * 8 + -0x20) =
                   bb_insn;
              uVar3 = bb_insn->index;
              pcVar37 = (char *)((ulong)uVar3 + 1);
              pcStack_138 = (code *)0x16a41b;
              pgVar38 = pgVar41;
              bitmap_expand((bitmap_t)pgVar41,(size_t)pcVar37);
              pgVar26 = (gen_ctx *)(ulong)(uVar3 >> 6);
              ppvVar1 = &pgVar41->curr_func_item->data + (long)pgVar26;
              *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)uVar3 & 0x3f));
              pgVar34 = pgStack_128;
            }
          }
        }
        pgVar21 = (gen_ctx *)pgVar21->addr_regs;
      } while (pgVar21 != (gen_ctx *)0x0);
    }
    pgVar36 = pgVar34;
    pgVar23 = (gen_ctx *)pgStack_130->ctx;
    if (pgVar23 != (gen_ctx *)0x0) {
      pgVar29 = (gen_ctx *)0x0;
      pgVar21 = pgStack_100;
      pgStack_98 = pgVar41;
      do {
        if ((MIR_insn_t)pgStack_130->curr_func_item == (MIR_insn_t)0x0) goto LAB_0016adc8;
        pgVar20 = (gen_ctx *)
                  **(undefined8 **)
                    ((long)((MIR_insn_t)pgStack_130->curr_func_item)->ops +
                    (long)pgVar29 * 8 + -0x20);
        pgStack_108 = (gen_ctx *)((ulong)pgVar20->debug_file >> 0x20);
        pMStack_110 = (MIR_context_t)&pgVar20->debug_level;
        pgStack_e0 = (gen_ctx *)&pgVar20->to_free;
        pMStack_b8 = (MIR_context_t)-(long)pgStack_108;
        pgVar39 = (gen_ctx *)0x0;
        pgStack_d8 = pgVar29;
LAB_0016a4ab:
        bVar44 = true;
        if (pgVar39 < pgStack_108) {
          ppVVar32 = pgStack_e0->call_used_hard_regs + (long)pgVar39 * 6 + -0xd;
          ppgVar16 = &pMStack_b8->gen_ctx;
          pgVar27 = (gen_ctx *)0x0;
          do {
            pgVar26 = (gen_ctx *)
                      ((long)&((FILE *)(pgVar27->call_used_hard_regs + -0xd))->_flags +
                      (long)&((FILE *)(pgVar39->call_used_hard_regs + -0xd))->_flags);
            pgVar38 = (gen_ctx *)pgStack_128->ctx;
            pcStack_138 = (code *)0x16a4ec;
            pcVar37 = (char *)pgVar20;
            MIR_insn_op_mode((MIR_context_t)pgVar38,(MIR_insn_t_conflict)pgVar20,(size_t)pgVar26,
                             &iStack_a8);
            pgVar36 = pgStack_128;
            pgVar41 = pgStack_98;
            pgVar21 = pgStack_100;
            if ((iStack_a8 != 0) && (*(char *)ppVVar32 != '\v')) {
              if (*(char *)ppVVar32 != '\x02') {
LAB_0016ad95:
                pcStack_138 = (code *)0x16adb4;
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              pgVar39 = (gen_ctx *)((undefined1 *)((long)&pgVar39->ctx + 1) + (long)pgVar27);
              bVar44 = false;
              goto LAB_0016a55e;
            }
            pgVar27 = (gen_ctx *)((long)&pgVar27->ctx + 1);
            ppVVar32 = ppVVar32 + 6;
          } while ((char *)((long)&((FILE *)(pgVar39->call_used_hard_regs + -0xd))->_flags +
                           (long)ppgVar16) + (long)pgVar27 != (char *)0x0);
          pgVar26 = (gen_ctx *)(ulong)(uint)((int)pgVar39 + -1 + (int)pgVar27);
          pgVar39 = (gen_ctx *)
                    ((long)&((FILE *)(pgVar27->call_used_hard_regs + -0xd))->_flags +
                    (long)&((FILE *)(pgVar39->call_used_hard_regs + -0xd))->_flags);
          bVar44 = true;
        }
LAB_0016a55e:
        if (!bVar44) {
          pgVar27 = (&pMStack_110->gen_ctx)[(long)(int)pgVar26 * 6];
          if (pgVar27 != (gen_ctx *)0x0) {
            do {
              pgStack_120 = pgVar26;
              pcStack_138 = (code *)0x16a599;
              pcVar37 = (char *)pgVar21;
              pgVar38 = pgVar36;
              iVar17 = loop_invariant_p(pgVar36,(loop_node_t_conflict)pgVar21,
                                        (bb_insn_t_conflict)pgVar27->ctx,(bitmap_t)pgVar41);
              if (iVar17 != 0) {
                uVar3 = *(uint *)((long)&pgVar27->ctx->c2mir_ctx + 4);
                uVar28 = (ulong)uVar3;
                pcStack_138 = (code *)0x16a5b3;
                pgVar38 = pgVar41;
                bitmap_expand((bitmap_t)pgVar41,uVar28 + 1);
                uVar3 = uVar3 >> 6;
                pvVar11 = (&pgVar41->curr_func_item->data)[uVar3];
                pcVar37 = (char *)((ulong)pvVar11 | 1L << (uVar28 & 0x3f));
                (&pgVar41->curr_func_item->data)[uVar3] = pcVar37;
                pgVar36 = pgStack_128;
                if (((ulong)pvVar11 >> (uVar28 & 0x3f) & 1) == 0) {
                  pgVar38 = (gen_ctx *)pgStack_130->curr_func_item;
                  if (pgVar38 == (gen_ctx *)0x0) {
                    pcStack_138 = (code *)0x16adb9;
                    loop_licm_cold_2();
                    goto LAB_0016adb9;
                  }
                  pMVar24 = pgVar27->ctx;
                  pMVar22 = (MIR_insn_t)((long)&pgStack_130->ctx->gen_ctx + 1);
                  if (((DLIST_LINK_MIR_insn_t *)&pgStack_130->optimize_level)->prev < pMVar22) {
                    pMVar33 = (MIR_insn_t)((long)pMVar22->ops + (((ulong)pMVar22 >> 1) - 0x20));
                    pcStack_138 = (code *)0x16a60d;
                    pMVar22 = (MIR_insn_t)realloc(pgVar38,(long)pMVar33 * 8);
                    pgStack_130->curr_func_item = (MIR_item_t)pMVar22;
                    ((DLIST_LINK_MIR_insn_t *)&pgStack_130->optimize_level)->prev = pMVar33;
                    pgVar21 = pgStack_100;
                  }
                  pMVar12 = pgStack_130->ctx;
                  pgStack_130->ctx = (MIR_context_t)((long)&pMVar12->gen_ctx + 1);
                  *(MIR_context_t *)
                   ((long)((MIR_insn_t)pgStack_130->curr_func_item)->ops + (long)pMVar12 * 8 + -0x20
                   ) = pMVar24;
                  pgVar36 = pgStack_128;
                  pcVar37 = (char *)pgStack_130;
                }
              }
              pgVar27 = *(gen_ctx **)&pgVar27->debug_level;
              pgVar26 = pgStack_120;
            } while (pgVar27 != (gen_ctx *)0x0);
            pgVar27 = (gen_ctx *)0x0;
          }
          goto LAB_0016a4ab;
        }
        pgVar29 = (gen_ctx *)((long)&pgStack_d8->ctx + 1);
        pgVar23 = (gen_ctx *)pgStack_130->ctx;
      } while (pgVar29 < pgVar23);
    }
    pgVar39 = pgVar38;
    pgVar29 = pgStack_c8;
    if ((pgStack_c8 != (gen_ctx *)0x0) && (pgStack_c8->curr_func_item != (MIR_item_t)0x0)) {
      pgStack_c8->ctx = (MIR_context_t)0x0;
      pgVar29 = pgStack_130;
      if (0 < (int)(uint)pgVar23) {
        pMVar24 = (MIR_context_t)(ulong)((uint)pgVar23 & 0x7fffffff);
        pgVar21 = pgStack_c8;
LAB_0016a697:
        if (((MIR_insn_t)pgVar29->curr_func_item != (MIR_insn_t)0x0) &&
           (pMVar12 = (MIR_context_t)((long)&pMVar24[-1].wrapper_end_addr + 7),
           pMVar12 < pgVar29->ctx)) {
          pgVar20 = *(gen_ctx **)
                     ((long)((MIR_insn_t)pgVar29->curr_func_item)->ops + (long)pMVar24 * 8 + -0x28);
          pMStack_110 = pgVar20->ctx;
          pMStack_f0 = pMVar24;
          pMStack_e8 = pMVar12;
          if (((FILE *)pgVar36->debug_file != (FILE *)0x0) && (1 < pgVar36->debug_level)) {
            pcStack_138 = (code *)0x16a6f3;
            fwrite("  Considering invariant ",0x18,1,(FILE *)pgVar36->debug_file);
            pcStack_138 = (code *)0x16a700;
            print_bb_insn(pgVar36,(bb_insn_t_conflict)pgVar20,0);
            pgVar29 = pgStack_130;
          }
          uVar3 = *(uint *)&pgVar20->field_0xc;
          if (((ulong)((long)pgVar21->ctx << 6) <= (ulong)uVar3) ||
             (((ulong)(&pgVar21->curr_func_item->data)[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) ==
              0)) {
            if (((uint)*(ulong *)&pMStack_110->func_redef_permission_p & 0xfffffffe) != 0x2c) {
              pgVar27 = (gen_ctx *)(*(ulong *)&pMStack_110->func_redef_permission_p >> 0x20);
              pgStack_108 = (gen_ctx *)&pMStack_110->insn_nops;
              pgStack_d8 = (gen_ctx *)0x0;
              uStack_c0 = 0;
              iStack_114 = 0;
              pMVar24 = pMStack_110;
              pgStack_e0 = pgVar27;
              pgStack_90 = pgVar20;
              do {
                in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
                pgVar38 = pgStack_d8;
                uVar28 = uStack_c0;
                if (pgStack_d8 < pgVar27) {
                  do {
                    pgVar20 = pgVar38;
                    pcStack_138 = (code *)0x16a7ff;
                    MIR_insn_op_mode(pgVar36->ctx,(MIR_insn_t_conflict)pMVar24,(size_t)pgVar20,
                                     &iStack_f4);
                    pMVar24 = pMStack_110;
                    pgVar29 = pgStack_130;
                    pgVar27 = pgStack_e0;
                    if ((iStack_f4 == 0) ||
                       (uVar31 = uVar28,
                       *(char *)(pgStack_108->call_used_hard_regs + (long)pgVar20 * 6 + -0xc) ==
                       '\v')) {
                      if (uVar28 < 2) {
                        uVar30 = uVar28;
                        do {
                          if (*(char *)(pgStack_108->call_used_hard_regs + (long)pgVar20 * 6 + -0xc)
                              != '\v') {
                            if (uVar28 != 1) {
                              uVar31 = 0;
                              uVar30 = uVar28;
                              if (*(char *)(pgStack_108->call_used_hard_regs +
                                           (long)pgVar20 * 6 + -0xc) != '\x02') goto LAB_0016a874;
LAB_0016a89b:
                              uStack_c0 = uVar30 + 1;
                              in_R11 = 0;
                              pgVar26 = (gen_ctx *)((ulong)pgVar20 & 0xffffffff);
                              pgStack_d8 = pgVar20;
                              goto LAB_0016a8b3;
                            }
                            break;
                          }
                          if (*(int *)((long)pgStack_108->call_used_hard_regs +
                                      (ulong)(uVar30 != 0) * 4 + (long)pgVar20 * 0x30 + -0x48) != -1
                             ) goto LAB_0016a89b;
                          uVar30 = uVar30 + 1;
                        } while (uVar30 == 1);
                      }
                      uVar31 = 0;
                    }
LAB_0016a874:
                    pgVar38 = (gen_ctx *)((long)&pgVar20->ctx + 1);
                    uVar28 = uVar31;
                  } while (pgVar38 != pgStack_e0);
                  pgVar26 = (gen_ctx *)((ulong)pgVar20 & 0xffffffff);
                  in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
                  pgStack_d8 = pgVar38;
                  uStack_c0 = uVar31;
                }
LAB_0016a8b3:
                if ((char)in_R11 != '\0') goto LAB_0016aaf7;
                iStack_114 = 1;
                if ((_IO_FILE *)pgStack_108->call_used_hard_regs[(long)(int)pgVar26 * 6 + -0xd] !=
                    (_IO_FILE *)0x0) {
                  pgVar20 = (gen_ctx *)
                            ((_IO_FILE *)
                            pgStack_108->call_used_hard_regs[(long)(int)pgVar26 * 6 + -0xd])->
                            _IO_read_ptr;
                  uVar3 = *(uint *)&pgVar20->field_0xc;
                  uVar28 = (ulong)uVar3;
                  if (((uVar28 < (ulong)((long)pgVar41->ctx << 6)) &&
                      (((ulong)(&pgVar41->curr_func_item->data)[uVar3 >> 6] >> (uVar28 & 0x3f) & 1)
                       != 0)) &&
                     (((ulong)((long)pgVar21->ctx << 6) <= uVar28 ||
                      (((ulong)(&pgVar21->curr_func_item->data)[uVar3 >> 6] >> (uVar28 & 0x3f) & 1)
                       == 0)))) {
                    pMStack_b8 = pgVar20->ctx;
                    uStack_70 = *(ulong *)&pMStack_b8->func_redef_permission_p >> 0x20;
                    lStack_78 = -uStack_70;
                    pHVar25 = (HTAB_MIR_item_t *)&pMStack_b8->unspec_protos;
                    uVar28 = 0;
                    uStack_cc = (uint)in_R11;
                    pgVar38 = pgVar21;
                    pgStack_120 = pgVar26;
                    pgStack_a0 = pgVar20;
                    ppVStack_80 = (VARR_MIR_proto_t **)pHVar25;
LAB_0016a978:
                    uVar18 = (undefined4)CONCAT71((int7)((ulong)pHVar25 >> 8),1);
                    if (uVar28 < uStack_70) {
                      lVar15 = lStack_78 + uVar28;
                      ppVVar35 = ppVStack_80 + uVar28 * 6;
                      lVar43 = 0;
                      do {
                        pgVar38 = (gen_ctx *)(uVar28 + lVar43);
                        pcStack_138 = (code *)0x16a9cb;
                        MIR_insn_op_mode(pgStack_128->ctx,(MIR_insn_t_conflict)pMStack_b8,
                                         (size_t)pgVar38,&iStack_a4);
                        pgVar26 = pgStack_120;
                        pgVar36 = pgStack_128;
                        pgVar20 = pgStack_a0;
                        pMVar24 = pMStack_110;
                        pgVar29 = pgStack_130;
                        pgVar27 = pgStack_e0;
                        if ((iStack_a4 != 0) && (*(char *)ppVVar35 != '\v')) {
                          if (*(char *)ppVVar35 != '\x02') goto LAB_0016ad95;
                          uVar28 = uVar28 + 1 + lVar43;
                          uVar18 = 0;
                          in_R11 = (ulong)uStack_cc;
                          goto LAB_0016aa5f;
                        }
                        lVar43 = lVar43 + 1;
                        ppVVar35 = ppVVar35 + 6;
                      } while (lVar15 + lVar43 != 0);
                      pgVar38 = (gen_ctx *)(ulong)(uint)((int)uVar28 + -1 + (int)lVar43);
                      uVar28 = uVar28 + lVar43;
                      in_R11 = (ulong)uStack_cc;
                      uVar18 = 1;
                    }
LAB_0016aa5f:
                    pgVar21 = pgStack_c8;
                    if ((char)uVar18 == '\0') {
                      pHVar25 = (HTAB_MIR_item_t *)
                                (&pgVar20->ctx->insn_nops)[(long)(int)pgVar38 * 6];
                      uStack_ac = uVar18;
                      if (pHVar25 != (HTAB_MIR_item_t *)0x0) {
                        do {
                          uVar3 = *(uint *)((long)&(*(VARR_MIR_proto_t **)pHVar25)->size + 4);
                          uStack_88 = uVar28;
                          if (((ulong)((long)pgVar41->ctx << 6) <= (ulong)uVar3) ||
                             (((ulong)(&pgVar41->curr_func_item->data)[uVar3 >> 6] >>
                               ((ulong)uVar3 & 0x3f) & 1) == 0)) {
                            iStack_114 = 1;
                            goto LAB_0016aaf7;
                          }
                          pHVar25 = (HTAB_MIR_item_t *)pHVar25->eq_func;
                        } while (pHVar25 != (HTAB_MIR_item_t *)0x0);
                        pHVar25 = (HTAB_MIR_item_t *)0x0;
                      }
                      goto LAB_0016a978;
                    }
                  }
                }
              } while( true );
            }
            pgVar27 = pgVar20;
            if (((FILE *)pgVar36->debug_file != (FILE *)0x0) && (1 < pgVar36->debug_level)) {
              pcStack_138 = (code *)0x16a793;
              fwrite("     -- marked as moved becuase it is costly\n",0x2d,1,
                     (FILE *)pgVar36->debug_file);
            }
            goto LAB_0016ab81;
          }
          if (((FILE *)pgVar36->debug_file != (FILE *)0x0) && (1 < pgVar36->debug_level)) {
            pcStack_138 = (code *)0x16a75b;
            fwrite("     -- already marked as moved\n",0x20,1,(FILE *)pgVar36->debug_file);
            pgVar29 = pgStack_130;
          }
          goto LAB_0016ab90;
        }
        goto LAB_0016adbe;
      }
LAB_0016aba4:
      if (pgVar29->ctx == (MIR_context_t)0x0) {
        return;
      }
      pgVar21 = (gen_ctx *)0x0;
      while ((MIR_insn_t)pgVar29->curr_func_item != (MIR_insn_t)0x0) {
        pgVar41 = *(gen_ctx **)
                   ((long)((MIR_insn_t)pgVar29->curr_func_item)->ops + (long)pgVar21 * 8 + -0x20);
        uVar3 = *(uint *)&pgVar41->field_0xc;
        if (((ulong)uVar3 < (ulong)((long)pgStack_c8->ctx << 6)) &&
           (((ulong)(&pgStack_c8->curr_func_item->data)[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) !=
            0)) {
          if (((FILE *)pgVar36->debug_file != (FILE *)0x0) && (1 < pgVar36->debug_level)) {
            pcStack_138 = (code *)0x16ac20;
            fprintf((FILE *)pgVar36->debug_file,"  Move invariant (target bb%lu) %-5lu",
                    **(undefined8 **)((long)((MIR_op_t *)&pgStack_100->debug_level)->data + 8));
            pcStack_138 = (code *)0x16ac2d;
            print_bb_insn(pgVar36,(bb_insn_t_conflict)pgVar41,0);
          }
          pgVar29 = (gen_ctx *)(((MIR_insn_t)pgStack_100->curr_func_item)->insn_link).prev[1].data;
          if (pgVar29 == (gen_ctx *)0x0) goto LAB_0016adcd;
          pgVar38 = *(gen_ctx **)((long)((MIR_op_t *)&pgStack_100->debug_level)->data + 8);
          pgVar39 = (gen_ctx *)pgVar36->ctx;
          pcVar37 = (char *)pgVar41->ctx;
          pgVar27 = (gen_ctx *)pgVar38->temp_bitmap2;
          pVVar13 = *(VARR_size_t **)&pgVar41->debug_level;
          pgVar26 = *(gen_ctx **)&pgVar41->addr_insn_p;
          if (pVVar13 == (VARR_size_t *)0x0) {
            if ((gen_ctx *)pgVar26->temp_bitmap == pgVar41) {
              pgVar26->temp_bitmap = (bitmap_t)pgVar41->to_free;
              goto LAB_0016ac87;
            }
LAB_0016adf1:
            pcStack_138 = (code *)0x16adf6;
            loop_licm_cold_4();
          }
          else {
            pVVar13[1].varr = (size_t *)pgVar41->to_free;
LAB_0016ac87:
            pgStack_120 = pgVar39;
            if ((VARR_MIR_proto_t *)pgVar41->to_free != (VARR_MIR_proto_t *)0x0) {
              ppVVar32 = (bitmap_t *)&((VARR_MIR_proto_t *)pgVar41->to_free)[1].size;
LAB_0016acad:
              pgVar20 = (gen_ctx *)&pgVar38->temp_bitmap;
              *ppVVar32 = (bitmap_t)pVVar13;
              *(VARR_size_t **)&pgVar41->debug_level = (VARR_size_t *)0x0;
              pgVar41->to_free = (VARR_void_ptr_t *)0x0;
              pgVar39 = (gen_ctx *)&((pgVar36->curr_func_item->u).func)->insns;
              pcStack_138 = (code *)0x16acdc;
              pgStack_128 = (gen_ctx_t)pcVar37;
              pgStack_108 = pgVar38;
              DLIST_MIR_insn_t_remove((DLIST_MIR_insn_t *)pgVar39,(MIR_insn_t)pcVar37);
              pgVar23 = pgStack_108;
              if ((pgVar27 == (gen_ctx *)0x0) || (pgVar27->ctx->func_redef_permission_p != 0x76)) {
                pVVar13 = (VARR_size_t *)pgStack_108->temp_bitmap2;
                pgVar26 = pgStack_128;
                if (pVVar13 == (VARR_size_t *)0x0) {
                  pgVar27 = pgStack_108;
                  if (*(bitmap_t *)pgVar20 != (bitmap_t)0x0) goto LAB_0016ae0a;
                }
                else {
                  if (pVVar13[1].varr != (size_t *)0x0) {
                    pcStack_138 = (code *)0x16adf1;
                    loop_licm_cold_6();
                    pgVar38 = pgVar39;
                    pgVar27 = pgVar23;
                    goto LAB_0016adf1;
                  }
                  pgVar20 = (gen_ctx *)&pVVar13[1].varr;
                }
                pgVar20->ctx = (MIR_context_t)pgVar41;
                pgVar41->to_free = (VARR_void_ptr_t *)0x0;
                *(VARR_size_t **)&pgVar41->debug_level = pVVar13;
                pgStack_108->temp_bitmap2 = (bitmap_t)pgVar41;
              }
              else {
                pcStack_138 = (code *)0x16acf8;
                DLIST_bb_insn_t_insert_before
                          ((DLIST_bb_insn_t *)pgVar20,(bb_insn_t_conflict)pgVar27,
                           (bb_insn_t_conflict)pgVar41);
                pgVar29 = pgVar27;
              }
              pgVar26 = pgStack_108;
              pcStack_138 = (code *)0x16ad62;
              MIR_insert_insn_before
                        ((MIR_context_t)pgStack_120,pgVar36->curr_func_item,
                         (MIR_insn_t_conflict)pgVar29->ctx,(MIR_insn_t_conflict)pgStack_128);
              *(gen_ctx **)&pgVar41->addr_insn_p = pgVar26;
              uStack_d0 = 1;
              pgVar29 = pgStack_130;
              goto LAB_0016ad73;
            }
            if ((gen_ctx *)pgVar26->temp_bitmap2 == pgVar41) {
              ppVVar32 = &pgVar26->temp_bitmap2;
              goto LAB_0016acad;
            }
          }
          pcStack_138 = (code *)0x16adfb;
          loop_licm_cold_5();
          goto LAB_0016adfb;
        }
LAB_0016ad73:
        pgVar21 = (gen_ctx *)((long)&pgVar21->ctx + 1);
        if ((gen_ctx *)pgVar29->ctx <= pgVar21) {
          return;
        }
      }
LAB_0016adc3:
      pcStack_138 = (code *)0x16adc8;
      loop_licm_cold_8();
LAB_0016adc8:
      pcStack_138 = (code *)0x16adcd;
      loop_licm_cold_3();
LAB_0016adcd:
      pcStack_138 = (code *)0x16adec;
      __assert_fail("before != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x14d2,"void licm_move_insn(gen_ctx_t, bb_insn_t, bb_t, bb_insn_t)");
    }
  }
  pcStack_138 = (code *)0x16ae0a;
  loop_licm_cold_10();
LAB_0016ae0a:
  pcStack_138 = DLIST_bb_t_insert_before;
  loop_licm_cold_7();
  if (((pgVar39 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar37 == (gen_ctx *)0x0)) ||
     (*(c2mir_ctx **)&pgVar39->optimize_level == (c2mir_ctx *)0x0)) {
    pcStack_140 = (code *)0x16ae63;
    DLIST_bb_t_insert_before_cold_3();
LAB_0016ae63:
    pcStack_140 = (code *)0x16ae68;
    DLIST_bb_t_insert_before_cold_1();
  }
  else {
    pvVar11 = ((MIR_op_t *)&((gen_ctx *)pcVar37)->debug_level)->data;
    pgVar26 = (gen_ctx *)pgVar39->ctx;
    if (pvVar11 != (void *)0x0) {
      if (pgVar26 != (gen_ctx *)0x0) {
        *(gen_ctx **)((long)pvVar11 + 0x28) = extraout_RDX;
        *(void **)&extraout_RDX->debug_level = pvVar11;
        ((MIR_op_t *)&((gen_ctx *)pcVar37)->debug_level)->data = extraout_RDX;
        extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar37;
        return;
      }
      goto LAB_0016ae63;
    }
    if (pgVar26 == (gen_ctx *)pcVar37) {
      ((MIR_op_t *)&((gen_ctx *)pcVar37)->debug_level)->data = extraout_RDX;
      extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar37;
      *(undefined8 *)&extraout_RDX->debug_level = 0;
      pgVar39->ctx = (MIR_context_t)extraout_RDX;
      return;
    }
  }
  pcStack_140 = DLIST_loop_node_t_insert_after;
  DLIST_bb_t_insert_before_cold_2();
  if (((pgVar39 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar37 == (gen_ctx *)0x0)) ||
     ((gen_ctx *)pgVar39->ctx == (gen_ctx *)0x0)) {
    pgStack_148 = (gen_ctx *)0x16aec2;
    DLIST_loop_node_t_insert_after_cold_3();
  }
  else {
    pVVar14 = ((gen_ctx *)pcVar37)->addr_regs;
    pgVar26 = *(gen_ctx **)&pgVar39->optimize_level;
    if (pVVar14 == (bitmap_t)0x0) {
      if (pgVar26 == (gen_ctx *)pcVar37) {
        ((gen_ctx *)pcVar37)->addr_regs = extraout_RDX_00;
        extraout_RDX_00[2].size = (size_t)pcVar37;
        extraout_RDX_00[2].varr = (bitmap_el_t *)0x0;
        *(bitmap_t *)&pgVar39->optimize_level = extraout_RDX_00;
        return;
      }
      goto LAB_0016aec7;
    }
    if (pgVar26 != (gen_ctx *)0x0) {
      pVVar14[2].size = (size_t)extraout_RDX_00;
      extraout_RDX_00[2].varr = &pVVar14->els_num;
      ((gen_ctx *)pcVar37)->addr_regs = extraout_RDX_00;
      extraout_RDX_00[2].size = (size_t)pcVar37;
      return;
    }
  }
  pgStack_148 = (gen_ctx *)0x16aec7;
  DLIST_loop_node_t_insert_after_cold_1();
LAB_0016aec7:
  pgStack_148 = (gen_ctx *)loop_invariant_p;
  DLIST_loop_node_t_insert_after_cold_2();
  pMVar22 = (MIR_insn_t)*extraout_RDX_01;
  uVar3 = (uint)*(ulong *)&pMVar22->field_0x18;
  if ((((uVar3 - 0xa5 < 0xffffffd1) &&
       ((0x14 < uVar3 - 0xa6 || ((0x104071U >> (uVar3 - 0xa6 & 0x1f) & 1) == 0)))) &&
      (uVar3 - 0xaa < 0xfffffffd)) &&
     (((0x3b < uVar3 || ((0xf1e000000000000U >> (*(ulong *)&pMVar22->field_0x18 & 0x3f) & 1) == 0))
      && (6 < uVar3 - 0xad)))) {
    pgStack_170 = pgVar36;
    pgStack_168 = pgVar41;
    pgStack_160 = pgVar21;
    pgStack_158 = pgVar27;
    pgStack_150 = pgVar29;
    pgStack_148 = pgVar20;
    if (*(int *)&pMVar22->field_0x1c != 0) {
      uVar28 = 0;
      pMVar33 = pMVar22;
      do {
        paVar42 = &pMVar33->ops[0].u;
        cVar2 = pMVar33->ops[0].field_0x8;
        if (cVar2 == '\x02') {
          uStack_198 = uVar28;
          iVar17 = bitmap_bit_p(pgVar39->tied_regs,(ulong)paVar42->reg);
          uVar28 = uStack_198;
          if (iVar17 != 0) {
            return;
          }
        }
        else if (cVar2 == '\v') {
          return;
        }
        uVar28 = uVar28 + 1;
        pMVar33 = (MIR_insn_t)paVar42;
      } while (uVar28 < *(uint *)&pMVar22->field_0x1c);
    }
    iStack_190.nops = (size_t)*(uint *)&pMVar22->field_0x1c;
    iStack_190.op_num = 0;
    iStack_190.op_part_num = 0;
    iStack_190.insn = pMVar22;
    iVar17 = input_insn_var_iterator_next(pgVar39,&iStack_190,&MStack_19c,&iStack_1a0);
    if (iVar17 != 0) {
      do {
        pvVar11 = pMVar22->ops[iStack_1a0].data;
        if (pvVar11 == (void *)0x0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        lVar15 = *(long *)((long)pvVar11 + 8);
        if (pgVar26 == (gen_ctx *)0x0) {
LAB_0016b015:
          pgVar21 = (gen_ctx *)pcVar37;
          do {
            pgVar21 = (gen_ctx *)pgVar21->debug_file;
            if (pgVar21 == (gen_ctx *)0x0) {
              return;
            }
          } while (pgVar21 != *(gen_ctx **)(*(long *)(*(long *)(lVar15 + 0x30) + 0x98) + 0x18));
        }
        else {
          uVar3 = *(uint *)(lVar15 + 0xc);
          if (((ulong)((long)pgVar26->ctx << 6) <= (ulong)uVar3) ||
             ((*(ulong *)((long)((MIR_insn_t)pgVar26->curr_func_item)->ops +
                         (ulong)(uVar3 >> 6) * 8 + -0x20) >> ((ulong)uVar3 & 0x3f) & 1) == 0))
          goto LAB_0016b015;
        }
        iVar17 = input_insn_var_iterator_next(pgVar39,&iStack_190,&MStack_19c,&iStack_1a0);
      } while (iVar17 != 0);
    }
  }
  return;
LAB_0016adb9:
  pcStack_138 = (code *)0x16adbe;
  loop_licm_cold_1();
LAB_0016adbe:
  pcStack_138 = (code *)0x16adc3;
  loop_licm_cold_9();
  goto LAB_0016adc3;
LAB_0016aaf7:
  __s = (FILE *)pgVar36->debug_file;
  if ((__s != (FILE *)0x0) && (1 < *(int *)&((MIR_op_t *)&pgVar36->debug_level)->data)) {
    pgStack_120 = pgVar26;
    if (iStack_114 == 0) {
      pcStack_138 = (code *)0x16ab56;
      fwrite("     -- can\'t be moved because single insn\n",0x2b,1,__s);
    }
    else {
      pcVar37 = "can\'t";
      if ((char)in_R11 != '\0') {
        pcVar37 = "can";
      }
      pcStack_138 = (code *)0x16ab3b;
      fprintf(__s,"     -- %s be moved because reg presure consideration\n",pcVar37);
    }
    in_R11 = in_R11 & 0xffffffff;
    pgVar29 = pgStack_130;
    pgVar26 = pgStack_120;
  }
  bVar40 = (byte)in_R11 ^ 1 | iStack_114 == 0;
  in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar40);
  pgVar27 = pgStack_90;
  if (bVar40 == 0) {
LAB_0016ab81:
    pcStack_138 = (code *)0x16ab8c;
    mark_as_moved(pgVar36,(bb_insn_t_conflict)pgVar27,(bitmap_t)pgVar41,(bitmap_t)pgVar21);
    pgVar29 = pgStack_130;
  }
LAB_0016ab90:
  pMVar24 = pMStack_e8;
  if ((long)pMStack_f0 < 2) goto LAB_0016aba4;
  goto LAB_0016a697;
}

Assistant:

static void licm_add_loop_preheaders (gen_ctx_t gen_ctx, loop_node_t loop) {
  int subloop_p = FALSE;
  bb_insn_t bb_insn;
  edge_t e;

  for (loop_node_t node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      licm_add_loop_preheaders (gen_ctx, node); /* process sub-loops */
    }
  /* See loop_licm where we process only the nested loops: */
  if (subloop_p || loop == curr_cfg->root_loop_node) return;
  loop->u.preheader = NULL;
  if ((e = find_loop_entry_edge (loop->entry->bb)) == NULL) return;
  if ((bb_insn = DLIST_TAIL (bb_insn_t, e->src->bb_insns)) == NULL || bb_insn->insn->code == MIR_JMP
      || !MIR_any_branch_code_p (bb_insn->insn->code)) {
    loop->u.preheader = e->src->loop_node;      /* The preheader already exists */
    e->src->loop_node->u.preheader_loop = loop; /* The preheader already exists */
  } else {
    create_preheader_from_edge (gen_ctx, e, loop);
  }
}